

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError * __thiscall
duckdb::CSVError::InvalidUTF8
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          idx_t current_column,LinesPerBoundary error_info,string *csv_row,idx_t row_byte_position,
          optional_idx byte_position,string *current_path)

{
  LinesPerBoundary error_info_p;
  ostream *poVar1;
  string local_380;
  string local_360;
  string local_340;
  ostringstream how_to_fix_it;
  ostringstream error;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar1 = ::std::operator<<((ostream *)&error,
                             "Invalid unicode (byte sequence mismatch) detected. This file is not ")
  ;
  poVar1 = ::std::operator<<(poVar1,(string *)&this[4].byte_position);
  poVar1 = ::std::operator<<(poVar1," encoded.");
  ::std::operator<<(poVar1,'\n');
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&how_to_fix_it);
  poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,
                             "Possible Solution: Set the correct encoding, if available, to read this CSV File (e.g., encoding=\'UTF-16\')"
                            );
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,
                             "Possible Solution: Enable ignore errors (ignore_errors=true) to skip this row"
                            );
  ::std::operator<<(poVar1,'\n');
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::string((string *)&local_380,(string *)error_info.lines_in_batch);
  ::std::__cxx11::stringbuf::str();
  error_info_p.lines_in_batch = error_info.boundary_idx;
  error_info_p.boundary_idx = current_column;
  CSVError(__return_storage_ptr__,&local_360,INVALID_ENCODING,(idx_t)options,&local_380,error_info_p
           ,(idx_t)csv_row,(optional_idx)row_byte_position,(CSVReaderOptions *)this,&local_340,
           (string *)byte_position.index);
  ::std::__cxx11::string::~string((string *)&local_340);
  ::std::__cxx11::string::~string((string *)&local_380);
  ::std::__cxx11::string::~string((string *)&local_360);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&how_to_fix_it);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::InvalidUTF8(const CSVReaderOptions &options, idx_t current_column, LinesPerBoundary error_info,
                               string &csv_row, idx_t row_byte_position, optional_idx byte_position,
                               const string &current_path) {
	std::ostringstream error;
	// How many columns were expected and how many were found
	error << "Invalid unicode (byte sequence mismatch) detected. This file is not " << options.encoding << " encoded."
	      << '\n';
	std::ostringstream how_to_fix_it;
	how_to_fix_it
	    << "Possible Solution: Set the correct encoding, if available, to read this CSV File (e.g., encoding='UTF-16')"
	    << '\n';
	how_to_fix_it << "Possible Solution: Enable ignore errors (ignore_errors=true) to skip this row" << '\n';
	return CSVError(error.str(), INVALID_ENCODING, current_column, csv_row, error_info, row_byte_position,
	                byte_position, options, how_to_fix_it.str(), current_path);
}